

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::GetHandle<std::__cxx11::string,category_const&>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_category_ptr *f)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
  *f_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
  local_38;
  jsonrpccxx *local_18;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_category_ptr *f_local;
  
  local_18 = this;
  f_local = (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_category_ptr *)
            __return_storage_ptr__;
  std::function<std::__cxx11::string(category_const&)>::
  function<std::__cxx11::string(*&)(category_const&),void>
            ((function<std::__cxx11::string(category_const&)> *)&local_38,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_category_ptr
              **)&local_18);
  GetHandle<std::__cxx11::string,category_const&>
            (__return_storage_ptr__,(jsonrpccxx *)&local_38,f_00);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_category_&)>
  ::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (*f)(ParamTypes...)) {
    return GetHandle(std::function<ReturnType(ParamTypes...)>(f));
  }